

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Optional<unsigned_long> Corrade::Utility::Path::size(StringView filename)

{
  int iVar1;
  char *__filename;
  FILE *__stream;
  Debug *pDVar2;
  int *piVar3;
  size_t in_RCX;
  char *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  anon_union_8_1_49ece5b0_for_Optional<unsigned_long>_1 this;
  Optional<unsigned_long> OVar5;
  StringView value;
  StringView value_00;
  StringView value_01;
  StringView view;
  ScopeGuard exit;
  Error err;
  _func_void *local_d0;
  FILE *local_c8;
  stat local_c0;
  
  value._data = (String *)filename._sizePlusFlags;
  this._value = (unsigned_long)filename._data;
  view._sizePlusFlags = in_RCX;
  view._data = in_RDX;
  Containers::String::nullTerminatedView((String *)&local_c0,value._data,view);
  __filename = Containers::String::data((String *)&local_c0);
  __stream = fopen(__filename,"rb");
  Containers::String::~String((String *)&local_c0);
  if (__stream == (FILE *)0x0) {
    Error::Error((Error *)&local_c0,(Flags)0x0);
    pDVar2 = Debug::operator<<((Debug *)&local_c0,"Utility::Path::size(): can\'t open");
    value_00._sizePlusFlags = (size_t)in_RDX;
    value_00._data = (char *)value._data;
    pDVar2 = Debug::operator<<(pDVar2,value_00);
    (pDVar2->_immediateFlags)._value = (pDVar2->_immediateFlags)._value | 4;
    Debug::operator<<(pDVar2,":");
    piVar3 = __errno_location();
    Implementation::printErrnoErrorString((Debug *)&local_c0,*piVar3);
    *(anon_unknown_23 *)(this._value + 8) = (anon_unknown_23)0x0;
    Error::~Error((Error *)&local_c0);
    uVar4 = extraout_RDX;
  }
  else {
    local_d0 = fclose;
    local_c8 = __stream;
    iVar1 = fileno(__stream);
    iVar1 = fstat(iVar1,&local_c0);
    if ((iVar1 == 0) && ((local_c0.st_mode & 0xf000) == 0x4000)) {
      Error::Error((Error *)&local_c0,(Flags)0x0);
      pDVar2 = Debug::operator<<((Debug *)&local_c0,"Utility::Path::size():");
      value._sizePlusFlags = (size_t)in_RDX;
      pDVar2 = Debug::operator<<(pDVar2,value);
      Debug::operator<<(pDVar2,"is a directory");
      Error::~Error((Error *)&local_c0);
      *(anon_unknown_23 *)(this._value + 8) = (anon_unknown_23)0x0;
    }
    else {
      anon_unknown_23::size((anon_unknown_23 *)this,(FILE *)__stream);
      if (*(anon_unknown_23 *)(this._value + 8) == (anon_unknown_23)0x0) {
        Error::Error((Error *)&local_c0,(Flags)0x0);
        pDVar2 = Debug::operator<<((Debug *)&local_c0,"Utility::Path::size():");
        value_01._sizePlusFlags = (size_t)in_RDX;
        value_01._data = (char *)value._data;
        pDVar2 = Debug::operator<<(pDVar2,value_01);
        Debug::operator<<(pDVar2,"is not seekable");
        Error::~Error((Error *)&local_c0);
      }
    }
    Containers::ScopeGuard::ScopeGuard<_IO_FILE_*,_int_(*)(_IO_FILE_*)>::anon_class_1_0_00000001::
    __invoke(&local_d0,&local_c8);
    uVar4 = extraout_RDX_00;
  }
  OVar5._8_8_ = uVar4;
  OVar5.field_0._value = this._value;
  return OVar5;
}

Assistant:

Containers::Optional<std::size_t> size(const Containers::StringView filename) {
    /* Special case for "Unicode" Windows support */
    #ifndef CORRADE_TARGET_WINDOWS
    std::FILE* const f = std::fopen(Containers::String::nullTerminatedView(filename).data(), "rb");
    #else
    std::FILE* const f = _wfopen(Unicode::widen(filename), L"rb");
    #endif
    if(!f) {
        Error err;
        err << "Utility::Path::size(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return {};
    }

    Containers::ScopeGuard exit{f, std::fclose};

    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    /* Explicitly fail if opening directories for reading on Unix to prevent
       silent errors, see isDirectory(int) for details. On Windows the fopen()
       fails already. */
    if(isDirectory(fileno(f))) {
        Error{} << "Utility::Path::size():" << filename << "is a directory";
        return {};
    }
    #endif

    Containers::Optional<std::size_t> size_ = size(f);
    if(!size_)
        Error{} << "Utility::Path::size():" << filename << "is not seekable";
    return size_;
}